

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

byte Z80::GetByteNoMem(char **p,bool signedCheck)

{
  char *badValueMessage;
  byte bVar1;
  int iVar2;
  undefined8 in_RAX;
  EStatus type;
  char *message;
  aint val;
  undefined8 uStack_18;
  
  badValueMessage = lp;
  if (DAT_0018e518 == 0) {
    bVar1 = GetByte((char **)((ulong)p & 0xff),signedCheck);
    return bVar1;
  }
  uStack_18 = in_RAX;
  iVar2 = ParseExpressionMemAccess(&lp,(aint *)((long)&uStack_18 + 4));
  if (iVar2 == 2) {
    message = "Illegal instruction (can\'t access memory)";
    type = PASS3;
  }
  else {
    if (iVar2 == 1) {
      if ((char)p != '\0') {
        check8o(uStack_18._4_4_);
        return uStack_18._4_1_;
      }
      check8(uStack_18._4_4_);
      return uStack_18._4_1_;
    }
    message = "Operand expected";
    type = IF_FIRST;
  }
  Error(message,badValueMessage,type);
  return '\0';
}

Assistant:

static byte GetByteNoMem(char*& p, bool signedCheck = false) {
		if (0 == Options::syx.MemoryBrackets) return GetByte(p, signedCheck); // legacy behaviour => don't care
		aint val; char* const oldP = p;
		switch (ParseExpressionMemAccess(p, val)) {
		case 1:					// valid constant (not a memory access) => return value
			if (signedCheck) check8o(val);
			else check8(val);
			return val & 255;
		case 2:					// valid memory access => report error
			Error("Illegal instruction (can't access memory)", oldP);
			return 0;
		default:				// parsing failed, report syntax error
			Error("Operand expected", oldP, IF_FIRST);
			return 0;
		}
	}